

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

StandardButton
showNewMessageBox(QWidget *parent,Icon icon,QString *title,QString *text,StandardButtons buttons,
                 StandardButton defaultButton)

{
  bool bVar1;
  QFlagsStorage<Qt::WindowType> QVar2;
  Int IVar3;
  ButtonRole BVar4;
  int iVar5;
  QPushButton *pQVar6;
  QWidget *in_RCX;
  QMessageBox *in_RDX;
  StandardButton in_ESI;
  QString *in_RDI;
  QFlagsStorage<QMessageBox::StandardButton> in_R9D;
  long in_FS_OFFSET;
  QPushButton *button;
  uint sb;
  uint mask;
  QDialogButtonBox *buttonBox;
  int ret;
  int otherButtons;
  int defaultButtons;
  QMessageBox msgBox;
  FindChildOption in_stack_ffffffffffffff2c;
  enum_type in_stack_ffffffffffffff30;
  enum_type in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  uint3 in_stack_ffffffffffffff58;
  uint uVar7;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffff5c;
  QPushButton *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar8;
  QString *in_stack_ffffffffffffff70;
  Icon in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff88;
  StandardButton local_50;
  QFlagsStorageHelper<QMessageBox::StandardButton,_4> local_4c;
  undefined1 local_40 [16];
  int in_stack_ffffffffffffffd0;
  QFlagsStorageHelper<QMessageBox::StandardButton,_4> local_14;
  QFlagsStorageHelper<QMessageBox::StandardButton,_4> local_10;
  QFlags<QMessageBox::StandardButton> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (uint)in_stack_ffffffffffffff58;
  if (in_R9D.i != 0) {
    local_10.super_QFlagsStorage<QMessageBox::StandardButton>.i =
         (QFlagsStorage<QMessageBox::StandardButton>)
         QFlags<QMessageBox::StandardButton>::operator&
                   ((QFlags<QMessageBox::StandardButton> *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
    bVar1 = QFlags<QMessageBox::StandardButton>::operator!
                      ((QFlags<QMessageBox::StandardButton> *)&local_10);
    uVar7 = CONCAT13(bVar1,(int3)uVar7);
  }
  if ((char)(uVar7 >> 0x18) == '\0') {
    memset(local_40,0xaa,0x28);
    QFlags<QMessageBox::StandardButton>::QFlags
              ((QFlags<QMessageBox::StandardButton> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    QVar2.i = (Int)Qt::operator|(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    QMessageBox::QMessageBox
              ((QMessageBox *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (Icon)((ulong)in_stack_ffffffffffffff60 >> 0x20),
               (QString *)CONCAT44(in_stack_ffffffffffffff5c.i,uVar7),in_RDI,
               (StandardButtons)in_R9D.i,in_RCX,(WindowFlags)in_stack_ffffffffffffff88.i);
    QFlags<Qt::FindChildOption>::QFlags
              ((QFlags<Qt::FindChildOption> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c);
    QObject::findChild<QDialogButtonBox*>
              ((QObject *)CONCAT44(in_ESI,in_stack_ffffffffffffff38),
               (FindChildOptions)in_stack_ffffffffffffff5c.i);
    uVar8 = 0x400;
    while (uVar8 < 0x8000001) {
      local_4c.super_QFlagsStorage<QMessageBox::StandardButton>.i =
           (QFlagsStorage<QMessageBox::StandardButton>)
           QFlags<QMessageBox::StandardButton>::operator&
                     ((QFlags<QMessageBox::StandardButton> *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff2c);
      IVar3 = QFlags::operator_cast_to_int((QFlags *)&local_4c);
      uVar8 = uVar8 << 1;
      if (IVar3 != 0) {
        in_stack_ffffffffffffff60 = QMessageBox::addButton(in_RDX,in_ESI);
        pQVar6 = QMessageBox::defaultButton
                           ((QMessageBox *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        if ((pQVar6 == (QPushButton *)0x0) &&
           (((in_R9D.i == 0 &&
             (BVar4 = QDialogButtonBox::buttonRole
                                ((QDialogButtonBox *)CONCAT44(in_stack_ffffffffffffff5c.i,uVar7),
                                 (QAbstractButton *)CONCAT44(uVar8,IVar3)), BVar4 == AcceptRole)) ||
            ((in_R9D.i != 0 && (IVar3 == in_R9D.i)))))) {
          QMessageBox::setDefaultButton
                    ((QMessageBox *)CONCAT44(in_ESI,in_stack_ffffffffffffff38),
                     (QPushButton *)CONCAT44(in_stack_ffffffffffffff5c.i,uVar7));
        }
      }
    }
    iVar5 = QDialog::exec((QDialog *)in_stack_ffffffffffffff60);
    if (iVar5 == -1) {
      local_50 = Cancel;
    }
    else {
      QMessageBox::clickedButton
                ((QMessageBox *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_50 = QMessageBox::standardButton
                           ((QMessageBox *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (QAbstractButton *)CONCAT44(in_stack_ffffffffffffff2c,QVar2.i));
    }
    QMessageBox::~QMessageBox((QMessageBox *)0x7a6d90);
  }
  else {
    local_14.super_QFlagsStorage<QMessageBox::StandardButton>.i =
         (QFlagsStorage<QMessageBox::StandardButton>)
         operator|(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
    QFlags::operator_cast_to_int((QFlags *)&local_14);
    IVar3 = QFlags<QMessageBox::StandardButton>::toInt(&local_c);
    local_50 = QMessageBoxPrivate::showOldMessageBox
                         ((QWidget *)CONCAT44(IVar3,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                          (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_50;
}

Assistant:

static QMessageBox::StandardButton showNewMessageBox(QWidget *parent,
    QMessageBox::Icon icon,
    const QString& title, const QString& text,
    QMessageBox::StandardButtons buttons,
    QMessageBox::StandardButton defaultButton)
{
    // necessary for source compatibility with Qt 4.0 and 4.1
    // handles (Yes, No) and (Yes|Default, No)
    if (defaultButton && !(buttons & defaultButton)) {
        const int defaultButtons = defaultButton | QMessageBox::Default;
        const int otherButtons = buttons.toInt();
        const int ret = QMessageBoxPrivate::showOldMessageBox(parent, icon, title,
                                                              text, otherButtons,
                                                              defaultButtons, 0);
        return static_cast<QMessageBox::StandardButton>(ret);
    }

    QMessageBox msgBox(icon, title, text, QMessageBox::NoButton, parent);
    QDialogButtonBox *buttonBox = msgBox.findChild<QDialogButtonBox*>();
    Q_ASSERT(buttonBox != nullptr);

    uint mask = QMessageBox::FirstButton;
    while (mask <= QMessageBox::LastButton) {
        uint sb = buttons & mask;
        mask <<= 1;
        if (!sb)
            continue;
        QPushButton *button = msgBox.addButton((QMessageBox::StandardButton)sb);
        // Choose the first accept role as the default
        if (msgBox.defaultButton())
            continue;
        if ((defaultButton == QMessageBox::NoButton && buttonBox->buttonRole(button) == QDialogButtonBox::AcceptRole)
            || (defaultButton != QMessageBox::NoButton && sb == uint(defaultButton)))
            msgBox.setDefaultButton(button);
    }
    if (msgBox.exec() == -1)
        return QMessageBox::Cancel;
    return msgBox.standardButton(msgBox.clickedButton());
}